

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParseContent(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlChar *pxVar2;
  unsigned_long uVar3;
  xmlParserInputPtr pxVar4;
  xmlChar xVar5;
  uint uVar6;
  xmlChar *pxVar7;
  
  iVar1 = ctxt->nameNr;
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  if (ctxt->mlType == XML_TYPE_XML) {
    pxVar4 = ctxt->input;
    xVar5 = *pxVar4->cur;
    pxVar7 = pxVar4->cur;
    while ((xVar5 != '\0' && (ctxt->instate != XML_PARSER_EOF))) {
      uVar3 = pxVar4->consumed;
      if (xVar5 == '&') {
        xmlParseReference(ctxt);
      }
      else if (xVar5 == '<') {
        xVar5 = pxVar7[1];
        if (xVar5 == '!') {
          if (((((pxVar7[2] == '[') && (pxVar7[3] == 'C')) && (pxVar7[4] == 'D')) &&
              ((pxVar7[5] == 'A' && (pxVar7[6] == 'T')))) &&
             ((pxVar7[7] == 'A' && (pxVar7[8] == '[')))) {
            xmlParseCDSect(ctxt);
          }
          else {
            if ((pxVar7[2] != '-') || (pxVar7[3] != '-')) goto LAB_00166095;
            xmlParseComment(ctxt);
            ctxt->instate = XML_PARSER_CONTENT;
          }
        }
        else if (xVar5 == '/') {
          if (ctxt->nameNr <= iVar1) {
            return;
          }
          xmlParseElementEnd(ctxt);
        }
        else if (xVar5 == '?') {
          xmlParsePI(ctxt);
        }
        else {
LAB_00166095:
          xmlParseElementStart(ctxt);
        }
      }
      else {
        xmlParseCharData(ctxt,0);
      }
      pxVar4 = ctxt->input;
      if (ctxt->progressive == 0) {
        if ((long)pxVar4->end - (long)pxVar4->cur < 0xfa) {
          xmlGROW(ctxt);
          pxVar4 = ctxt->input;
          if (ctxt->progressive != 0) goto LAB_001660aa;
        }
        if ((500 < (long)pxVar4->cur - (long)pxVar4->base) &&
           ((long)pxVar4->end - (long)pxVar4->cur < 500)) {
          xmlSHRINK(ctxt);
          pxVar4 = ctxt->input;
        }
      }
LAB_001660aa:
      pxVar2 = pxVar4->cur;
      if (((ulong)(uint)uVar3 == pxVar4->consumed) && (pxVar7 == pxVar2)) {
LAB_00166337:
        xmlFatalErr(ctxt,XML_ERR_INTERNAL_ERROR,"detected an error in element content\n");
        xmlHaltParser(ctxt);
        return;
      }
      xVar5 = *pxVar2;
      pxVar7 = pxVar2;
    }
  }
  else {
    ctxt->quoted = 0;
    pxVar4 = ctxt->input;
    xVar5 = *pxVar4->cur;
    pxVar7 = pxVar4->cur;
    while ((((xVar5 != '\0' && ((ctxt->curly != 0 || ((xVar5 != '\n' && (xVar5 != ';')))))) &&
            (xVar5 != '}')) && (ctxt->instate != XML_PARSER_EOF))) {
      uVar3 = pxVar4->consumed;
      uVar6 = ctxt->quoted;
      if (xVar5 == '\"') {
        uVar6 = (uint)(uVar6 == 0);
        ctxt->quoted = uVar6;
        pxVar4->cur = pxVar7 + 1;
        pxVar4->col = pxVar4->col + 1;
        if (pxVar7[1] == '\0') {
          xmlParserInputGrow(pxVar4,0xfa);
          uVar6 = ctxt->quoted;
        }
      }
      xVar5 = *pxVar7;
      if (uVar6 == 0) {
        if (xVar5 == '?') {
          xmlParsePI(ctxt);
        }
        else if (xVar5 == ';') {
          pxVar4 = ctxt->input;
          pxVar2 = pxVar4->cur;
          pxVar4->cur = pxVar2 + 1;
          pxVar4->col = pxVar4->col + 1;
          if (pxVar2[1] == '\0') {
            xmlParserInputGrow(pxVar4,0xfa);
          }
          xVar5 = *pxVar7;
          if (((xVar5 != ' ') && (1 < (byte)(xVar5 - 9))) && (xVar5 != '\r')) goto LAB_001661c4;
LAB_0016629c:
          xmlParseCharData(ctxt,0);
        }
        else {
          pxVar2 = ctxt->input->cur;
          if (((*pxVar2 == '<') && (pxVar2[1] == '[')) && (pxVar2[2] == '[')) {
            xmlParseCDSect(ctxt);
          }
          else {
            if (xVar5 == ' ') goto LAB_0016629c;
            if (xVar5 == '#') {
              xmlParseComment(ctxt);
              ctxt->instate = XML_PARSER_CONTENT;
            }
            else {
              if ((((byte)(xVar5 - 9) < 2) || (xVar5 == '\r')) || (xVar5 == '\"'))
              goto LAB_0016629c;
              if (ctxt->curly != 1) goto LAB_001661c4;
              xmlParseElement(ctxt);
            }
          }
        }
      }
      else {
LAB_001661c4:
        if (xVar5 != '&') goto LAB_0016629c;
        xmlParseReference(ctxt);
      }
      pxVar4 = ctxt->input;
      if (ctxt->progressive == 0) {
        if ((long)pxVar4->end - (long)pxVar4->cur < 0xfa) {
          xmlGROW(ctxt);
          pxVar4 = ctxt->input;
          if (ctxt->progressive != 0) goto LAB_001662b3;
        }
        if ((500 < (long)pxVar4->cur - (long)pxVar4->base) &&
           ((long)pxVar4->end - (long)pxVar4->cur < 500)) {
          xmlSHRINK(ctxt);
          pxVar4 = ctxt->input;
        }
      }
LAB_001662b3:
      pxVar2 = pxVar4->cur;
      if (((ulong)(uint)uVar3 == pxVar4->consumed) && (pxVar7 == pxVar2)) goto LAB_00166337;
      xVar5 = *pxVar2;
      pxVar7 = pxVar2;
    }
  }
  return;
}

Assistant:

void
xmlParseContent(xmlParserCtxtPtr ctxt) {
    int nameNr = ctxt->nameNr;

    DEBUG_ENTER(("xmlParseContent(%s);\n", dbgCtxt(ctxt)));
    GROW;
    if (ISXML) {						/* XML*/
	while ((RAW != 0) &&
	       (ctxt->instate != XML_PARSER_EOF)) {
	    const xmlChar *test = CUR_PTR;
	    unsigned int cons = ctxt->input->consumed;
	    const xmlChar *cur = ctxt->input->cur;

	    /*
	     * First case : a Processing Instruction.
	     */
	    if ((*cur == '<') && (cur[1] == '?')) {
		xmlParsePI(ctxt);
	    }

	    /*
	     * Second case : a CDSection
	     */
	    /* 2.6.0 test was *cur not RAW */
	    else if (CMP9(CUR_PTR, '<', '!', '[', 'C', 'D', 'A', 'T', 'A', '[')) {
		xmlParseCDSect(ctxt);
	    }

	    /*
	     * Third case :  a comment
	     */
	    else if ((*cur == '<') && (NXT(1) == '!') &&
		     (NXT(2) == '-') && (NXT(3) == '-')) {
		xmlParseComment(ctxt);
		ctxt->instate = XML_PARSER_CONTENT;
	    }

	    /*
	     * Fourth case :  a sub-element.
	     */
	    else if (*cur == '<') {
		if (NXT(1) == '/') {
		    if (ctxt->nameNr <= nameNr)
			break;
		    xmlParseElementEnd(ctxt);
		} else {
		    xmlParseElementStart(ctxt);
		}
	    }

	    /*
	     * Fifth case : a reference. If if has not been resolved,
	     *    parsing returns its Name, create the node
	     */

	    else if (*cur == '&') {
		xmlParseReference(ctxt);
	    }

	    /*
	     * Last case, text. Note that References are handled directly.
	     */
	    else {
		xmlParseCharData(ctxt, 0);
	    }

	    GROW;
	    SHRINK;

	    if ((cons == ctxt->input->consumed) && (test == CUR_PTR)) {
		xmlFatalErr(ctxt, XML_ERR_INTERNAL_ERROR,
			    "detected an error in element content\n");
		xmlHaltParser(ctxt);
		break;
	    }
	}
    } else {							/* SML */
    	ctxt->quoted = 0;
	while ((RAW != 0) &&
	       /* Within a {curly block}, new lines are part of the text
	          Else, they flag the end of the element */
	       /* Likewise, within a {curly block}, ; flags the end of an inner element
	          Else, they flag the end of the current element */
	       ((ctxt->curly) || ((RAW != '\n') && (RAW != ';'))) &&
	       (RAW != '}') &&
	       (ctxt->instate != XML_PARSER_EOF)) {
	    const xmlChar *test = CUR_PTR;
	    unsigned int cons = ctxt->input->consumed;
	    const xmlChar *cur = ctxt->input->cur;
	    XDEBUG_PRINTF(("*cur = '%s';\n", dbgChar(RAW)));
	    int iParsed = 0;

	    if (*cur == '"') {
		ctxt->quoted = !ctxt->quoted;
		SKIP(1);
	    }

	    if (!ctxt->quoted) {
		/*
		 * An element separator
		 */
		if (*cur == ';') {
		    SKIP(1);
		    if (IS_BLANK_CH(*cur) && (*cur != '\n')) {
			xmlParseCharData(ctxt, 0);
			iParsed = 1;
		    }
		}

		/*
		 * First case : a Processing Instruction.
		 */
		else if (*cur == '?') {
		    xmlParsePI(ctxt);
		    iParsed = 1;
		}

		/*
		 * Second case : a CDSection
		 */
		else if (CMP3(CUR_PTR, '<', '[', '[')) {
		    xmlParseCDSect(ctxt);
		    iParsed = 1;
		}

		/*
		 * Third case :  a comment
		 */
		else if (*cur == '#') {
		    xmlParseComment(ctxt);
		    ctxt->instate = XML_PARSER_CONTENT;
		    iParsed = 1;
		}

		/*
		 * Fourth case :  a sub-element.
		 */
		else if ((!IS_BLANK_CH(*cur)) && (*cur != '"') && (ctxt->curly == 1)) {
		    xmlParseElement(ctxt);
		    iParsed = 1;
		}
	    }

	    if (!iParsed) {
		/*
		 * Fifth case : a reference. If if has not been resolved,
		 *    parsing returns its Name, create the node
		 */

		if (*cur == '&') {
		    xmlParseReference(ctxt);
		}

		/*
		 * Last case, text. Note that References are handled directly.
		 */
		else {
		    xmlParseCharData(ctxt, 0);
		}
	    }

	    GROW;
	    SHRINK;

	    if ((cons == ctxt->input->consumed) && (test == CUR_PTR)) {
		xmlFatalErr(ctxt, XML_ERR_INTERNAL_ERROR,
			    "detected an error in element content\n");
		xmlHaltParser(ctxt);
		break;
	    }
	}
    }
    RETURN_COMMENT(("xmlParseContent. ctxt = %s;\n", dbgCtxt(ctxt)));
}